

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineMemory.cpp
# Opt level: O2

void Diligent::SetRawAllocator(IMemoryAllocator *pRawAllocator)

{
  string _msg;
  
  if (pRawAllocator == (IMemoryAllocator *)0x0) {
    FormatString<char[65]>
              (&_msg,(char (*) [65])
                     "User-defined allocator is not provided. Using default allocator.");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
    pRawAllocator = &DefaultRawMemoryAllocator::GetAllocator()->super_IMemoryAllocator;
  }
  if (g_pRawAllocator != pRawAllocator && g_pRawAllocator != (IMemoryAllocator *)0x0) {
    FormatString<char[126]>
              (&_msg,(char (*) [126])
                     "User-defined allocator has already been provided and does not match the new allocator. This may result in undefined behavior."
              );
    DebugAssertionFailed
              (_msg._M_dataplus._M_p,"SetRawAllocator",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineMemory.cpp"
               ,0x33);
    std::__cxx11::string::~string((string *)&_msg);
  }
  g_pRawAllocator = pRawAllocator;
  return;
}

Assistant:

void SetRawAllocator(IMemoryAllocator* pRawAllocator)
{
    if (pRawAllocator == nullptr)
    {
        LOG_INFO_MESSAGE("User-defined allocator is not provided. Using default allocator.");
        pRawAllocator = &DefaultRawMemoryAllocator::GetAllocator();
    }

    DEV_CHECK_ERR(g_pRawAllocator == nullptr || g_pRawAllocator == pRawAllocator,
                  "User-defined allocator has already been provided and does not match the new allocator. "
                  "This may result in undefined behavior.");

    g_pRawAllocator = pRawAllocator;
}